

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O2

void __thiscall QRhiWidgetPrivate::resetRenderTargetObjects(QRhiWidgetPrivate *this)

{
  if (this->renderTarget != (QRhiTextureRenderTarget *)0x0) {
    QRhiResource::deleteLater();
    this->renderTarget = (QRhiTextureRenderTarget *)0x0;
  }
  if (this->renderPassDescriptor != (QRhiRenderPassDescriptor *)0x0) {
    QRhiResource::deleteLater();
    this->renderPassDescriptor = (QRhiRenderPassDescriptor *)0x0;
  }
  if (this->depthStencilBuffer != (QRhiRenderBuffer *)0x0) {
    QRhiResource::deleteLater();
    this->depthStencilBuffer = (QRhiRenderBuffer *)0x0;
  }
  return;
}

Assistant:

void QRhiWidgetPrivate::resetRenderTargetObjects()
{
    if (renderTarget) {
        renderTarget->deleteLater();
        renderTarget = nullptr;
    }
    if (renderPassDescriptor) {
        renderPassDescriptor->deleteLater();
        renderPassDescriptor = nullptr;
    }
    if (depthStencilBuffer) {
        depthStencilBuffer->deleteLater();
        depthStencilBuffer = nullptr;
    }
}